

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object_State_Header.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Object_State_Header::Object_State_Header(Object_State_Header *this)

{
  Object_State_Header *this_local;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Object_State_Header_0032d268;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_ObjID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_RefObjID);
  this->m_ui16UpdateNum = 0;
  this->m_ui8ForceID = '\0';
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\t';
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x06';
  return;
}

Assistant:

Object_State_Header::Object_State_Header() :
    m_ui16UpdateNum( 0 ),
    m_ui8ForceID( 0 )
{
    m_ui8ProtocolFamily = SyntheticEnvironment;
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
}